

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * __thiscall
mocker::nasm::fmtAddr_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Addr> *addr)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  int64_t __val;
  element_type *this_01;
  element_type *peVar3;
  __shared_ptr *p_Var4;
  long lVar5;
  shared_ptr<mocker::nasm::Register> *psVar6;
  element_type *this_02;
  element_type *this_03;
  string *psVar7;
  shared_ptr<mocker::nasm::Addr> *addr_00;
  shared_ptr<mocker::nasm::Addr> *addr_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  shared_ptr<mocker::nasm::LabelAddr> p_4;
  shared_ptr<mocker::nasm::Label> p_3;
  string local_140;
  shared_ptr<mocker::nasm::Addr> local_120;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  shared_ptr<mocker::nasm::Addr> local_b0;
  string local_a0;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string res;
  shared_ptr<mocker::nasm::MemoryAddr> p_2;
  shared_ptr<mocker::nasm::Register> p_1;
  undefined1 local_28 [8];
  shared_ptr<mocker::nasm::NumericConstant> p;
  shared_ptr<mocker::nasm::Addr> *addr_local;
  
  p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
            ((shared_ptr<mocker::nasm::Addr> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
    __val = NumericConstant::getVal(this_00);
    std::__cxx11::to_string(__return_storage_ptr__,__val);
  }
  std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr
            ((shared_ptr<mocker::nasm::NumericConstant> *)local_28);
  if (!bVar1) {
    dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
              ((shared_ptr<mocker::nasm::Addr> *)
               &p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    if (bVar1) {
      this_01 = std::
                __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&p_2.
                                 super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      psVar7 = Register::getIdentifier_abi_cxx11_(this_01);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
    }
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)
               &p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar1) {
      dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                ((shared_ptr<mocker::nasm::Addr> *)((long)&res.field_2 + 8));
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)(res.field_2._M_local_buf + 8));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"[",&local_79);
        std::allocator<char>::~allocator(&local_79);
        peVar3 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(res.field_2._M_local_buf + 8));
        p_Var4 = (__shared_ptr *)MemoryAddr::getReg1(peVar3);
        bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var4);
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(res.field_2._M_local_buf + 8));
          psVar6 = MemoryAddr::getReg1(peVar3);
          std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                    (&local_b0,psVar6);
          fmtAddr_abi_cxx11_(&local_a0,(nasm *)&local_b0,addr_00);
          std::__cxx11::string::operator+=((string *)local_78,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_b0);
        }
        peVar3 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(res.field_2._M_local_buf + 8));
        p_Var4 = (__shared_ptr *)MemoryAddr::getReg2(peVar3);
        bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var4);
        if (bVar1) {
          lVar5 = std::__cxx11::string::size();
          if (lVar5 != 1) {
            std::__cxx11::string::operator+=((string *)local_78,"+");
          }
          peVar3 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(res.field_2._M_local_buf + 8));
          psVar6 = MemoryAddr::getReg2(peVar3);
          std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                    (&local_120,psVar6);
          fmtAddr_abi_cxx11_(&local_110,(nasm *)&local_120,addr_01);
          std::operator+(&local_f0,&local_110,"*");
          peVar3 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(res.field_2._M_local_buf + 8));
          iVar2 = MemoryAddr::getScale(peVar3);
          std::__cxx11::to_string(&local_140,iVar2);
          std::operator+(&local_d0,&local_f0,&local_140);
          std::__cxx11::string::operator+=((string *)local_78,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_120);
        }
        peVar3 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(res.field_2._M_local_buf + 8));
        iVar2 = MemoryAddr::getNumber(peVar3);
        if (iVar2 != 0) {
          peVar3 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(res.field_2._M_local_buf + 8));
          iVar2 = MemoryAddr::getNumber(peVar3);
          if (0 < iVar2) {
            std::__cxx11::string::operator+=((string *)local_78,"+");
          }
          peVar3 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(res.field_2._M_local_buf + 8));
          iVar2 = MemoryAddr::getNumber(peVar3);
          std::__cxx11::to_string
                    ((string *)
                     &p_3.super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,iVar2);
          std::__cxx11::string::operator+=
                    ((string *)local_78,
                     (string *)
                     &p_3.super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string
                    ((string *)
                     &p_3.super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"]");
        bVar1 = true;
        std::__cxx11::string::~string((string *)local_78);
      }
      else {
        bVar1 = false;
      }
      std::shared_ptr<mocker::nasm::MemoryAddr>::~shared_ptr
                ((shared_ptr<mocker::nasm::MemoryAddr> *)((long)&res.field_2 + 8));
      if (!bVar1) {
        dyc<mocker::nasm::Label,std::shared_ptr<mocker::nasm::Addr>const&>
                  ((shared_ptr<mocker::nasm::Addr> *)
                   &p_4.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &p_4.
                            super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar1) {
          this_02 = std::
                    __shared_ptr_access<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&p_4.
                                     super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          psVar7 = Label::getName_abi_cxx11_(this_02);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
        }
        std::shared_ptr<mocker::nasm::Label>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Label> *)
                   &p_4.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (!bVar1) {
          dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                    ((shared_ptr<mocker::nasm::Addr> *)local_180);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_180);
          if (bVar1) {
            this_03 = std::
                      __shared_ptr_access<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_180);
            psVar7 = LabelAddr::getLabelName_abi_cxx11_(this_03);
            std::operator+(&local_1a0,"[",psVar7);
            std::operator+(__return_storage_ptr__,&local_1a0,"]");
            std::__cxx11::string::~string((string *)&local_1a0);
          }
          std::shared_ptr<mocker::nasm::LabelAddr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::LabelAddr> *)local_180);
          if (!bVar1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                          ,0x35,"std::string mocker::nasm::fmtAddr(const std::shared_ptr<Addr> &)");
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtAddr(const std::shared_ptr<Addr> &addr) {
  if (auto p = dyc<NumericConstant>(addr))
    return std::to_string(p->getVal());
  if (auto p = dyc<Register>(addr))
    return p->getIdentifier();
  if (auto p = dyc<MemoryAddr>(addr)) {
    std::string res = "[";
    if (p->getReg1())
      res += fmtAddr(p->getReg1());
    if (p->getReg2()) {
      if (res.size() != 1)
        res += "+";
      res += fmtAddr(p->getReg2()) + "*" + std::to_string(p->getScale());
    }
    if (p->getNumber() != 0) {
      if (p->getNumber() > 0)
        res += "+";
      res += std::to_string(p->getNumber());
    }
    return res + "]";
  }
  if (auto p = dyc<Label>(addr)) {
    return p->getName();
  }
  if (auto p = dyc<LabelAddr>(addr)) {
    return "[" + p->getLabelName() + "]";
  }
  assert(false);
}